

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableMultiplicationGeneralizationImpl.hpp
# Opt level: O3

VariableRegion * __thiscall
Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion::meet
          (VariableRegion *__return_storage_ptr__,VariableRegion *this,VariableRegion *rhs)

{
  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
  *pDVar1;
  ulong uVar2;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *in_RCX;
  VariableRegion *other;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> local_50;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> local_30;
  
  other = rhs;
  if (((undefined1  [36])
       ((undefined1  [36])
        (this->_self)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
        .
        super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>
       & (undefined1  [36])0x1) == (undefined1  [36])0x0) &&
     (other = this,
     (undefined1  [36])
     ((undefined1  [36])
      (rhs->_self)._inner.
      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
      .
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
      .super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>
     & (undefined1  [36])0x1) == (undefined1  [36])0x0)) {
    intersectSortedStack<Inferences::AnyNumber<Kernel::MonomFactor>>
              (&local_50,
               (Inferences *)
               (this->_self)._inner.
               super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
               .
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
               .
               super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>
               ._content,
               (Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)
               (rhs->_self)._inner.
               super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
               .
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
               .
               super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>
               ._content,in_RCX);
    Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::Stack(&local_30,&local_50);
    *(undefined8 *)
     &(__return_storage_ptr__->_self)._inner.
      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
      .
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
      .super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>
         = 0;
    pDVar1 = &(__return_storage_ptr__->_self)._inner.
              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
              .
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
    ;
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[7] = '\0';
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[8] = '\0';
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[9] = '\0';
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[10] = '\0';
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[0xb] = '\0';
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[0xc] = '\0';
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[0xd] = '\0';
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[0xe] = '\0';
    pDVar1 = &(__return_storage_ptr__->_self)._inner.
              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
              .
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
    ;
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[0xf] = '\0';
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[0x10] = '\0';
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[0x11] = '\0';
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[0x12] = '\0';
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[0x13] = '\0';
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[0x14] = '\0';
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[0x15] = '\0';
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[0x16] = '\0';
    pDVar1 = &(__return_storage_ptr__->_self)._inner.
              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
              .
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
    ;
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[0x17] = '\0';
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[0x18] = '\0';
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[0x19] = '\0';
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[0x1a] = '\0';
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[0x1b] = '\0';
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[0x1c] = '\0';
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[0x1d] = '\0';
    (pDVar1->
    super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>).
    _content[0x1e] = '\0';
    *(undefined4 *)
     ((__return_storage_ptr__->_self)._inner.
      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
      .
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
      .super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>.
      _content + 0x1f) = 0;
    *(size_t *)
     (__return_storage_ptr__->_self)._inner.
     super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
     .
     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
     .super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>.
     _content = local_30._capacity;
    *(AnyNumber<Kernel::MonomFactor> **)
     ((__return_storage_ptr__->_self)._inner.
      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
      .
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
      .super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>.
      _content + 0x18) = local_30._end;
    *(AnyNumber<Kernel::MonomFactor> **)
     ((__return_storage_ptr__->_self)._inner.
      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
      .
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
      .super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>.
      _content + 8) = local_30._stack;
    *(AnyNumber<Kernel::MonomFactor> **)
     ((__return_storage_ptr__->_self)._inner.
      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
      .
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
      .super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>.
      _content + 0x10) = local_30._cursor;
    if (local_50._stack != (AnyNumber<Kernel::MonomFactor> *)0x0) {
      uVar2 = local_50._capacity << 5;
      if (uVar2 == 0) {
        *(undefined8 *)
         &((local_50._stack)->
          super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
          )._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          .
          super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
             = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_50._stack;
      }
      else if (uVar2 < 0x21) {
        *(undefined8 *)
         &((local_50._stack)->
          super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
          )._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          .
          super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
             = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_50._stack;
      }
      else if (uVar2 < 0x31) {
        *(undefined8 *)
         &((local_50._stack)->
          super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
          )._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          .
          super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
             = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_50._stack;
      }
      else if (uVar2 < 0x41) {
        *(undefined8 *)
         &((local_50._stack)->
          super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
          )._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          .
          super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
             = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_50._stack;
      }
      else {
        operator_delete(local_50._stack,0x10);
      }
    }
  }
  else {
    Lib::CoproductImpl::TrivialOperations::MoveCons::
    DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
    ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
                   *)__return_storage_ptr__,
                  (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
                   *)other);
  }
  return __return_storage_ptr__;
}

Assistant:

VariableRegion meet(VariableRegion rhs) 
  {
    auto& lhs = *this;
    if (lhs.isUninit()) return VariableRegion(std::move(rhs));
    if (rhs.isUninit()) return VariableRegion(std::move(lhs));
    return VariableRegion(intersectSortedStack(std::move(lhs.unwrap()), std::move(rhs.unwrap())));
  }